

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O1

int cpu_exec_mips64(uc_struct_conflict6 *uc,CPUState *cpu)

{
  uc_struct_conflict7 *puVar1;
  void *pvVar2;
  CPUWatchpoint *pCVar3;
  CPUClass *pCVar4;
  long lVar5;
  void *pvVar6;
  _func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *p_Var7;
  _func_void_CPUState_ptr_vaddr_conflict *p_Var8;
  vaddr vVar9;
  _Bool _Var10;
  byte bVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  TranslationBlock *pTVar17;
  TranslationBlock *pTVar18;
  TranslationBlock *pTVar19;
  uint uVar20;
  uint32_t cflags;
  CPUClass *pCVar21;
  list_item *plVar22;
  uint flags;
  uc_struct_conflict6 *puVar23;
  TranslationBlock_conflict *pTVar24;
  bool bVar25;
  uc_tb cur_tb;
  TranslationBlock *local_68;
  target_ulong local_50;
  uint16_t local_48;
  uint16_t local_46;
  target_ulong local_40;
  uint16_t local_38;
  uint16_t local_36;
  
  pCVar21 = cpu->cc;
  if (cpu->halted != 0) {
    if (pCVar21->has_work == (_func__Bool_CPUState_ptr_conflict *)0x0) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                 ,0x1bc,"cc->has_work");
    }
    _Var10 = (*pCVar21->has_work)((CPUState_conflict *)cpu);
    if (!_Var10) {
      return 0x10003;
    }
    cpu->halted = 0;
  }
  (*pCVar21->cpu_exec_enter)((CPUState_conflict *)cpu);
  iVar12 = __sigsetjmp(uc->exits + (long)uc->nested_level * 0x19 + 0x33,0);
  puVar23 = uc;
  if (iVar12 != 0) {
    pCVar21 = cpu->cc;
  }
  do {
    uVar16 = (uint)puVar23;
    puVar1 = cpu->uc;
    if ((puVar1->stop_interrupt == (uc_args_int_t_conflict7)0x0) ||
       (_Var10 = (*puVar1->stop_interrupt)(puVar1,cpu->exception_index), !_Var10)) {
      uVar13 = cpu->exception_index;
      if ((int)uVar13 < 0) {
        bVar25 = false;
      }
      else if ((int)uVar13 < 0x10000) {
        cpu[1].tb_jmp_cache[0x163] = (TranslationBlock *)puVar1->next_pc;
        bVar25 = false;
        for (plVar22 = puVar1->hook[0].head;
            (plVar22 != (list_item *)0x0 && (pvVar2 = plVar22->data, pvVar2 != (void *)0x0));
            plVar22 = plVar22->next) {
          if (*(char *)((long)pvVar2 + 0x14) == '\0') {
            (**(code **)((long)pvVar2 + 0x28))
                      (puVar1,cpu->exception_index,*(undefined8 *)((long)pvVar2 + 0x30));
            bVar25 = true;
          }
        }
        if (bVar25) {
          cpu->exception_index = -1;
          uVar16 = 0x10000;
        }
        else {
          puVar1->invalid_error = 0x15;
          cpu->halted = 1;
          uVar16 = 0x10001;
        }
        bVar25 = (bool)(bVar25 ^ 1);
      }
      else {
        if (uVar13 == 0x10002) {
          pCVar4 = cpu->cc;
          if (cpu->watchpoint_hit == (CPUWatchpoint *)0x0) {
            for (pCVar3 = (cpu->watchpoints).tqh_first; pCVar3 != (CPUWatchpoint *)0x0;
                pCVar3 = (pCVar3->entry).tqe_next) {
              *(byte *)&pCVar3->flags = (byte)pCVar3->flags & 0x3f;
            }
          }
          (*pCVar4->debug_excp_handler)((CPUState_conflict *)cpu);
        }
        cpu->exception_index = -1;
        bVar25 = true;
        uVar16 = uVar13;
      }
    }
    else {
      plVar22 = puVar1->hook[0xe].head;
      if (plVar22 == (list_item *)0x0) {
LAB_0088f4de:
        puVar1->invalid_error = 10;
      }
      else {
        bVar11 = 0;
        while (pvVar2 = plVar22->data, pvVar2 != (void *)0x0) {
          if (((*(char *)((long)pvVar2 + 0x14) == '\0') &&
              (bVar11 = (**(code **)((long)pvVar2 + 0x28))
                                  (puVar1,*(undefined8 *)((long)pvVar2 + 0x30)), bVar11 != 0)) ||
             (plVar22 = plVar22->next, plVar22 == (list_item *)0x0)) break;
        }
        if ((bVar11 & 1) == 0) goto LAB_0088f4de;
      }
      bVar25 = true;
      uVar16 = 0x10001;
    }
    if (bVar25) {
      uc->cpu->tcg_exit_req = 0;
      (*pCVar21->cpu_exec_exit)((CPUState_conflict *)cpu);
      return uVar16;
    }
    pTVar18 = (TranslationBlock *)0x0;
    pTVar17 = pTVar18;
LAB_0088f5ff:
    pCVar4 = cpu->cc;
    *(undefined2 *)((long)cpu[1].tb_jmp_cache + 0xa0a) = 0;
    uVar13 = cpu->interrupt_request;
    if (uVar13 == 0) {
LAB_0088f61a:
      if (cpu->exit_request == true) {
        cpu->exit_request = false;
        bVar25 = true;
        if (cpu->exception_index == -1) {
          cpu->exception_index = 0x10000;
        }
      }
      else {
        bVar25 = false;
      }
    }
    else {
      uVar20 = uVar13;
      if ((cpu->singlestep_enabled & 2) != 0) {
        uVar20 = uVar13 & 0xffffeda5;
      }
      if ((char)uVar20 < '\0') {
        cpu->interrupt_request = uVar13 & 0xffffff7f;
        cpu->exception_index = 0x10002;
      }
      else {
        if ((uVar20 >> 10 & 1) == 0) {
          _Var10 = (*pCVar4->cpu_exec_interrupt)((CPUState_conflict *)cpu,uVar20);
          if (_Var10) {
            cpu->exception_index = -1;
            pTVar17 = (TranslationBlock *)0x0;
          }
          if ((cpu->interrupt_request & 4) != 0) {
            cpu->interrupt_request = cpu->interrupt_request & 0xfffffffb;
            pTVar17 = (TranslationBlock *)0x0;
          }
          goto LAB_0088f61a;
        }
        cpu_reset(cpu);
      }
      bVar25 = true;
    }
    if (!bVar25) {
      cflags = cpu->cflags_next_tb;
      if (cflags == 0xffffffff) {
        cflags = 0;
      }
      else {
        cpu->cflags_next_tb = 0xffffffff;
      }
      puVar1 = cpu->uc;
      uVar14 = *(ulong *)((long)cpu->env_ptr + 0x100);
      flags = *(uint *)((long)cpu->env_ptr + 0x3e44) & 0x1fffffff;
      uVar13 = (uint)(uVar14 >> 6) ^ (uint)uVar14;
      uVar13 = uVar13 & 0x3f | uVar13 >> 6 & 0xfc0;
      local_68 = cpu->tb_jmp_cache[uVar13];
      uVar20 = cpu->cluster_index << 0x18 | cflags & 0xffffff;
      if ((((local_68 == (TranslationBlock *)0x0) || (local_68->pc != uVar14)) ||
          ((local_68->cs_base != 0 ||
           ((local_68->flags != flags ||
            (cpu->trace_dstate[0] != (ulong)local_68->trace_vcpu_dstate)))))) ||
         ((local_68->cflags & 0xff0effff) != uVar20)) {
        local_68 = (TranslationBlock *)0x0;
        pTVar19 = (TranslationBlock *)tb_htable_lookup_mips64(cpu,uVar14,0,flags,uVar20);
        if (pTVar19 != (TranslationBlock *)0x0) {
          cpu->tb_jmp_cache[uVar13] = pTVar19;
          local_68 = pTVar19;
        }
      }
      if (local_68 == (TranslationBlock *)0x0) {
        local_68 = tb_gen_code_mips64(cpu,uVar14,0,flags,cflags);
        cpu->tb_jmp_cache[uVar13] = local_68;
        pTVar19 = puVar1->last_tb;
        if (pTVar19 != (TranslationBlock *)0x0) {
          local_40 = local_68->pc;
          local_38 = local_68->icount;
          local_36 = local_68->size;
          local_50 = pTVar19->pc;
          local_48 = pTVar19->icount;
          local_46 = pTVar19->size;
          for (plVar22 = puVar1->hook[0xf].head;
              (plVar22 != (list_item *)0x0 && (pvVar2 = plVar22->data, pvVar2 != (void *)0x0));
              plVar22 = plVar22->next) {
            if (*(char *)((long)pvVar2 + 0x14) == '\0') {
              if (((*(ulong *)((long)pvVar2 + 0x18) <= local_68->pc) &&
                  (local_68->pc <= *(ulong *)((long)pvVar2 + 0x20))) ||
                 (*(ulong *)((long)pvVar2 + 0x20) < *(ulong *)((long)pvVar2 + 0x18))) {
                (**(code **)((long)pvVar2 + 0x28))
                          (puVar1,&local_40,&local_50,*(undefined8 *)((long)pvVar2 + 0x30));
              }
            }
          }
        }
      }
      if ((pTVar17 != (TranslationBlock *)0x0) && (local_68->page_addr[1] == 0xffffffffffffffff)) {
        if (1 < (uint)pTVar18) {
          __assert_fail("n < ARRAY_SIZE(tb->jmp_list_next)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                        ,0xda,"void tb_add_jump(TranslationBlock *, int, TranslationBlock *)");
        }
        if ((local_68->cflags & 0x40000) == 0) {
          LOCK();
          bVar25 = pTVar17->jmp_dest[(long)pTVar18] == 0;
          if (bVar25) {
            pTVar17->jmp_dest[(long)pTVar18] = (uintptr_t)local_68;
          }
          UNLOCK();
          if (bVar25) {
            pvVar2 = (pTVar17->tc).ptr;
            *(int *)(pTVar17->jmp_target_arg[(long)pTVar18] + (long)pvVar2) =
                 (*(int *)&(local_68->tc).ptr -
                 ((int)pTVar17->jmp_target_arg[(long)pTVar18] + (int)pvVar2)) + -4;
            pTVar17->jmp_list_next[(long)pTVar18] = local_68->jmp_list_head;
            local_68->jmp_list_head = (ulong)pTVar17 | (ulong)pTVar18;
          }
        }
      }
      if (cpu->exit_request == false) {
        pvVar2 = cpu->env_ptr;
        tb_exec_lock_mips64((TCGContext_conflict5 *)cpu->uc->tcg_ctx);
        uVar14 = (**(code **)(*(long *)(*(long *)((long)pvVar2 + 0x3ef0) + 0x2e8) + 0x90))(pvVar2);
        if (cpu->uc->nested_level == 1) {
          tb_exec_unlock_mips64((TCGContext_conflict5 *)cpu->uc->tcg_ctx);
        }
        cpu->can_do_io = 1;
        pTVar19 = (TranslationBlock *)(uVar14 & 0xfffffffffffffffc);
        if ((uVar14 & 2) != 0) {
          if (*(long *)(*(long *)((long)pvVar2 + 0x3ef0) + 0x358) == 0) {
            uVar13 = *(uint *)(*(long *)((long)pvVar2 + 0x3ef0) + 0x578);
            if (((0x12 < uVar13) || ((0x771c0U >> (uVar13 & 0x1f) & 1) == 0)) &&
               (cpu->uc->quit_request == false)) {
              p_Var7 = cpu->cc->synchronize_from_tb;
              if (p_Var7 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
                p_Var8 = cpu->cc->set_pc;
                if (p_Var8 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) goto LAB_0088fc3d;
                (*p_Var8)((CPUState_conflict *)cpu,pTVar19->pc);
              }
              else {
                (*p_Var7)((CPUState_conflict *)cpu,(TranslationBlock_conflict *)pTVar19);
              }
            }
          }
          cpu->tcg_exit_req = 0;
        }
        cpu->uc->last_tb = local_68;
        uVar13 = (uint)uVar14 & 3;
        pTVar18 = (TranslationBlock *)(ulong)uVar13;
        pTVar17 = pTVar19;
        if (uVar13 == 3) {
          pTVar17 = (TranslationBlock *)0x0;
          pTVar18 = (TranslationBlock *)0x3;
          if (-1 < *(int *)(cpu[1].tb_jmp_cache + 0x141)) {
            lVar5 = cpu->icount_budget;
            lVar15 = 0xffff;
            if (lVar5 < 0xffff) {
              lVar15 = lVar5;
            }
            uVar13 = (uint)lVar15;
            *(short *)(cpu[1].tb_jmp_cache + 0x141) = (short)lVar15;
            cpu->icount_extra = lVar5 - (int)uVar13;
            pTVar17 = (TranslationBlock *)0x0;
            pTVar18 = (TranslationBlock *)0x3;
            if (0 < (int)uVar13 && lVar5 - (int)uVar13 == 0) {
              uVar20 = 0x7fff;
              if ((int)uVar13 < 0x7fff) {
                uVar20 = uVar13;
              }
              pTVar17 = tb_gen_code_mips64(cpu,pTVar19->pc,pTVar19->cs_base,pTVar19->flags,
                                           uVar20 | 0x10000);
              pTVar17->orig_tb = pTVar19;
              pvVar2 = cpu->env_ptr;
              pvVar6 = (pTVar17->tc).ptr;
              tb_exec_lock_mips64((TCGContext_conflict5 *)cpu->uc->tcg_ctx);
              uVar14 = (**(code **)(*(long *)(*(long *)((long)pvVar2 + 0x3ef0) + 0x2e8) + 0x90))
                                 (pvVar2,pvVar6);
              if (cpu->uc->nested_level == 1) {
                tb_exec_unlock_mips64((TCGContext_conflict5 *)cpu->uc->tcg_ctx);
              }
              cpu->can_do_io = 1;
              if ((uVar14 & 2) != 0) {
                if (*(long *)(*(long *)((long)pvVar2 + 0x3ef0) + 0x358) == 0) {
                  uVar13 = *(uint *)(*(long *)((long)pvVar2 + 0x3ef0) + 0x578);
                  if (((0x12 < uVar13) || ((0x771c0U >> (uVar13 & 0x1f) & 1) == 0)) &&
                     (cpu->uc->quit_request == false)) {
                    pTVar24 = (TranslationBlock_conflict *)(uVar14 & 0xfffffffffffffffc);
                    p_Var7 = cpu->cc->synchronize_from_tb;
                    if (p_Var7 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
                      p_Var8 = cpu->cc->set_pc;
                      if (p_Var8 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) {
LAB_0088fc3d:
                        __assert_fail("cc->set_pc",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                                      ,0x61,
                                      "tcg_target_ulong cpu_tb_exec(CPUState *, TranslationBlock *)"
                                     );
                      }
                      vVar9._0_4_ = pTVar24->pc;
                      vVar9._4_4_ = pTVar24->cs_base;
                      (*p_Var8)((CPUState_conflict *)cpu,vVar9);
                    }
                    else {
                      (*p_Var7)((CPUState_conflict *)cpu,pTVar24);
                    }
                  }
                }
                cpu->tcg_exit_req = 0;
              }
              tb_phys_invalidate_mips64
                        ((TCGContext_conflict5 *)cpu->uc->tcg_ctx,pTVar17,0xffffffffffffffff);
              tcg_tb_remove_mips64((TCGContext_conflict5 *)cpu->uc->tcg_ctx,pTVar17);
              pTVar17 = (TranslationBlock *)0x0;
              pTVar18 = (TranslationBlock *)0x3;
            }
          }
        }
      }
      goto LAB_0088f5ff;
    }
    puVar23 = (uc_struct_conflict6 *)(ulong)uVar16;
  } while( true );
}

Assistant:

int cpu_exec(struct uc_struct *uc, CPUState *cpu)
{
    CPUClass *cc = CPU_GET_CLASS(cpu);
    int ret;
    // SyncClocks sc = { 0 };

    if (cpu_handle_halt(cpu)) {
        return EXCP_HALTED;
    }

    // rcu_read_lock();

    cc->cpu_exec_enter(cpu);

    /* Calculate difference between guest clock and host clock.
     * This delay includes the delay of the last cycle, so
     * what we have to do is sleep until it is 0. As for the
     * advance/delay we gain here, we try to fix it next time.
     */
    // init_delay_params(&sc, cpu);

    // Unicorn: We would like to support nested uc_emu_start calls.
    /* prepare setjmp context for exception handling */
    // if (sigsetjmp(cpu->jmp_env, 0) != 0) {
    if (sigsetjmp(uc->jmp_bufs[uc->nested_level - 1], 0) != 0) {
#if defined(__clang__) || !QEMU_GNUC_PREREQ(4, 6)
        /* Some compilers wrongly smash all local variables after
         * siglongjmp. There were bug reports for gcc 4.5.0 and clang.
         * Reload essential local variables here for those compilers.
         * Newer versions of gcc would complain about this code (-Wclobbered). */
        cc = CPU_GET_CLASS(cpu);
#else /* buggy compiler */
        /* Assert that the compiler does not smash local variables. */
        // g_assert(cpu == current_cpu);
        g_assert(cc == CPU_GET_CLASS(cpu));
#endif /* buggy compiler */

        assert_no_pages_locked();
    }

    /* if an exception is pending, we execute it here */
    while (!cpu_handle_exception(cpu, &ret)) {
        TranslationBlock *last_tb = NULL;
        int tb_exit = 0;

        while (!cpu_handle_interrupt(cpu, &last_tb)) {
            uint32_t cflags = cpu->cflags_next_tb;
            TranslationBlock *tb;

            /* When requested, use an exact setting for cflags for the next
               execution.  This is used for icount, precise smc, and stop-
               after-access watchpoints.  Since this request should never
               have CF_INVALID set, -1 is a convenient invalid value that
               does not require tcg headers for cpu_common_reset.  */
            if (cflags == -1) {
                cflags = curr_cflags();
            } else {
                cpu->cflags_next_tb = -1;
            }

            tb = tb_find(cpu, last_tb, tb_exit, cflags);
            if (unlikely(cpu->exit_request)) {
                continue;
            }
            cpu_loop_exec_tb(cpu, tb, &last_tb, &tb_exit);
            /* Try to align the host and virtual clocks
               if the guest is in advance */
            // align_clocks(&sc, cpu);
        }
    }

    // Unicorn: Clear any TCG exit flag that might have been left set by exit requests
    uc->cpu->tcg_exit_req = 0;

    cc->cpu_exec_exit(cpu);
    // rcu_read_unlock();

    return ret;
}